

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvert<float>
          (RendererImpl<short> *this,float *stereoStream,Bit32u len)

{
  Bit32u len_00;
  short renderingBuffer [8192];
  short asStack_4038 [8196];
  
  for (; len != 0; len = len - len_00) {
    len_00 = 0x1000;
    if (len < 0x1000) {
      len_00 = len;
    }
    doRender(this,asStack_4038,len_00);
    convertSampleFormat<short,float>(asStack_4038,stereoStream,len_00 * 2);
    stereoStream = (float *)((long)stereoStream + (ulong)(len_00 * 8));
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}